

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  pIVar4 = GImGui;
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar9 = (ulong)uVar1;
  if (uVar9 != 0) {
    uVar11 = 0;
    if (ref_window == (ImGuiWindow *)0x0) {
LAB_001c2c10:
      if ((int)uVar11 < (int)uVar1) {
        if ((pIVar4->DebugLogFlags & 4) != 0) {
          if (ref_window == (ImGuiWindow *)0x0) {
            pcVar8 = "<NULL>";
          }
          else {
            pcVar8 = ref_window->Name;
          }
          DebugLog("[popup] ClosePopupsOverWindow(\"%s\")\n",pcVar8);
        }
        ClosePopupToLevel((int)uVar11,restore_focus_to_window_under_popup);
        return;
      }
    }
    else {
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = uVar9;
      }
      lVar6 = 8;
      for (; uVar11 != uVar5; uVar11 = uVar11 + 1) {
        pIVar2 = (pIVar4->OpenPopupStack).Data;
        pIVar3 = pIVar2[uVar11].Window;
        if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar3->Flags & 0x1000000) == 0)) {
          puVar7 = (undefined8 *)((long)&pIVar2->PopupId + lVar6);
          uVar10 = uVar9;
          do {
            bVar12 = uVar10 == 0;
            uVar10 = uVar10 - 1;
            if (bVar12) goto LAB_001c2c10;
            if ((ImGuiWindow *)*puVar7 != (ImGuiWindow *)0x0) {
              bVar12 = IsWindowWithinBeginStackOf(ref_window,(ImGuiWindow *)*puVar7);
              if (bVar12) break;
            }
            puVar7 = puVar7 + 7;
          } while( true );
        }
        uVar9 = uVar9 - 1;
        lVar6 = lVar6 + 0x38;
      }
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (IsWindowWithinBeginStackOf(ref_window, popup_window))
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupsOverWindow(\"%s\")\n", ref_window ? ref_window->Name : "<NULL>");
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}